

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

TokenType soul::HEARTOperator::Matcher::match(UTF8Reader *text)

{
  bool bVar1;
  UTF8Reader *text_local;
  
  bVar1 = UTF8Reader::advanceIfStartsWith(text,";");
  if (bVar1) {
    text_local = (UTF8Reader *)0x54c9e0;
  }
  else {
    bVar1 = UTF8Reader::advanceIfStartsWith(text,".");
    if (bVar1) {
      text_local = (UTF8Reader *)0x548358;
    }
    else {
      bVar1 = UTF8Reader::advanceIfStartsWith(text,",");
      if (bVar1) {
        text_local = (UTF8Reader *)anon_var_dwarf_10ee90;
      }
      else {
        bVar1 = UTF8Reader::advanceIfStartsWith(text,"(");
        if (bVar1) {
          text_local = (UTF8Reader *)0x573c42;
        }
        else {
          bVar1 = UTF8Reader::advanceIfStartsWith(text,")");
          if (bVar1) {
            text_local = (UTF8Reader *)0x571824;
          }
          else {
            bVar1 = UTF8Reader::advanceIfStartsWith(text,"{");
            if (bVar1) {
              text_local = (UTF8Reader *)anon_var_dwarf_10eeb4;
            }
            else {
              bVar1 = UTF8Reader::advanceIfStartsWith(text,"}");
              if (bVar1) {
                text_local = (UTF8Reader *)0x54ceac;
              }
              else {
                bVar1 = UTF8Reader::advanceIfStartsWith(text,"[[");
                if (bVar1) {
                  text_local = (UTF8Reader *)anon_var_dwarf_10eecc;
                }
                else {
                  bVar1 = UTF8Reader::advanceIfStartsWith(text,"]]");
                  if (bVar1) {
                    text_local = (UTF8Reader *)0x54e281;
                  }
                  else {
                    bVar1 = UTF8Reader::advanceIfStartsWith(text,"[");
                    if (bVar1) {
                      text_local = (UTF8Reader *)0x575e01;
                    }
                    else {
                      bVar1 = UTF8Reader::advanceIfStartsWith(text,"]");
                      if (bVar1) {
                        text_local = (UTF8Reader *)0x54ace4;
                      }
                      else {
                        bVar1 = UTF8Reader::advanceIfStartsWith(text,"::");
                        if (bVar1) {
                          text_local = (UTF8Reader *)0x54d85e;
                        }
                        else {
                          bVar1 = UTF8Reader::advanceIfStartsWith(text,":");
                          if (bVar1) {
                            text_local = (UTF8Reader *)0x575e29;
                          }
                          else {
                            bVar1 = UTF8Reader::advanceIfStartsWith(text,"?");
                            if (bVar1) {
                              text_local = (UTF8Reader *)0x54ca0c;
                            }
                            else {
                              bVar1 = UTF8Reader::advanceIfStartsWith(text,"#");
                              if (bVar1) {
                                text_local = (UTF8Reader *)0x5742a3;
                              }
                              else {
                                bVar1 = UTF8Reader::advanceIfStartsWith(text,"==");
                                if (bVar1) {
                                  text_local = (UTF8Reader *)0x573b8b;
                                }
                                else {
                                  bVar1 = UTF8Reader::advanceIfStartsWith(text,"=");
                                  if (bVar1) {
                                    text_local = (UTF8Reader *)0x54e52c;
                                  }
                                  else {
                                    bVar1 = UTF8Reader::advanceIfStartsWith(text,"!=");
                                    if (bVar1) {
                                      text_local = (UTF8Reader *)anon_var_dwarf_10ef08;
                                    }
                                    else {
                                      bVar1 = UTF8Reader::advanceIfStartsWith(text,"!");
                                      if (bVar1) {
                                        text_local = (UTF8Reader *)0x54e09a;
                                      }
                                      else {
                                        bVar1 = UTF8Reader::advanceIfStartsWith(text,"->");
                                        if (bVar1) {
                                          text_local = (UTF8Reader *)0x54e748;
                                        }
                                        else {
                                          bVar1 = UTF8Reader::advanceIfStartsWith(text,"-");
                                          if (bVar1) {
                                            text_local = (UTF8Reader *)0x56f2f2;
                                          }
                                          else {
                                            bVar1 = UTF8Reader::advanceIfStartsWith(text,"+");
                                            if (bVar1) {
                                              text_local = (UTF8Reader *)0x54ca4e;
                                            }
                                            else {
                                              bVar1 = UTF8Reader::advanceIfStartsWith(text,"*");
                                              if (bVar1) {
                                                text_local = (UTF8Reader *)0x5747cb;
                                              }
                                              else {
                                                bVar1 = UTF8Reader::advanceIfStartsWith(text,"/");
                                                if (bVar1) {
                                                  text_local = (UTF8Reader *)0x54d9a0;
                                                }
                                                else {
                                                  bVar1 = UTF8Reader::advanceIfStartsWith(text,"%");
                                                  if (bVar1) {
                                                    text_local = (UTF8Reader *)anon_var_dwarf_10ef5c
                                                    ;
                                                  }
                                                  else {
                                                    bVar1 = UTF8Reader::advanceIfStartsWith
                                                                      (text,"^");
                                                    if (bVar1) {
                                                      text_local = (UTF8Reader *)
                                                                   anon_var_dwarf_107a35;
                                                    }
                                                    else {
                                                      bVar1 = UTF8Reader::advanceIfStartsWith
                                                                        (text,"~");
                                                      if (bVar1) {
                                                        text_local = (UTF8Reader *)
                                                                     anon_var_dwarf_10ef68;
                                                      }
                                                      else {
                                                        bVar1 = UTF8Reader::advanceIfStartsWith
                                                                          (text,"&&");
                                                        if (bVar1) {
                                                          text_local = (UTF8Reader *)
                                                                       anon_var_dwarf_10ef74;
                                                        }
                                                        else {
                                                          bVar1 = UTF8Reader::advanceIfStartsWith
                                                                            (text,"&");
                                                          if (bVar1) {
                                                            text_local = (UTF8Reader *)0x573639;
                                                          }
                                                          else {
                                                            bVar1 = UTF8Reader::advanceIfStartsWith
                                                                              (text,"||");
                                                            if (bVar1) {
                                                              text_local = (UTF8Reader *)
                                                                           anon_var_dwarf_10ef80;
                                                            }
                                                            else {
                                                              bVar1 = UTF8Reader::
                                                                      advanceIfStartsWith(text,"|");
                                                              if (bVar1) {
                                                                text_local = (UTF8Reader *)0x54e536;
                                                              }
                                                              else {
                                                                bVar1 = UTF8Reader::
                                                                        advanceIfStartsWith(text,
                                                  "<<");
                                                  if (bVar1) {
                                                    text_local = (UTF8Reader *)anon_var_dwarf_10ef98
                                                    ;
                                                  }
                                                  else {
                                                    bVar1 = UTF8Reader::advanceIfStartsWith
                                                                      (text,"<=");
                                                    if (bVar1) {
                                                      text_local = (UTF8Reader *)0x56f973;
                                                    }
                                                    else {
                                                      bVar1 = UTF8Reader::advanceIfStartsWith
                                                                        (text,"<-");
                                                      if (bVar1) {
                                                        text_local = (UTF8Reader *)
                                                                     anon_var_dwarf_10efb0;
                                                      }
                                                      else {
                                                        bVar1 = UTF8Reader::advanceIfStartsWith
                                                                          (text,"<");
                                                        if (bVar1) {
                                                          text_local = (UTF8Reader *)0x54e539;
                                                        }
                                                        else {
                                                          bVar1 = UTF8Reader::advanceIfStartsWith
                                                                            (text,">>>");
                                                          if (bVar1) {
                                                            text_local = (UTF8Reader *)
                                                                         anon_var_dwarf_10efbc;
                                                          }
                                                          else {
                                                            bVar1 = UTF8Reader::advanceIfStartsWith
                                                                              (text,">>");
                                                            if (bVar1) {
                                                              text_local = (UTF8Reader *)0x54e53f;
                                                            }
                                                            else {
                                                              bVar1 = UTF8Reader::
                                                                      advanceIfStartsWith(text,">=")
                                                              ;
                                                              if (bVar1) {
                                                                text_local = (UTF8Reader *)0x56f978;
                                                              }
                                                              else {
                                                                bVar1 = UTF8Reader::
                                                                        advanceIfStartsWith(text,">"
                                                  );
                                                  if (bVar1) {
                                                    text_local = (UTF8Reader *)0x574319;
                                                  }
                                                  else {
                                                    memset(&text_local,0,8);
                                                    TokenType::TokenType((TokenType *)&text_local);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (TokenType)(char *)text_local;
}

Assistant:

static TokenType match (UTF8Reader& text) noexcept
        {
            #define SOUL_COMPARE_OPERATOR(name, str) if (text.advanceIfStartsWith (str)) return name;
            SOUL_HEART_OPERATORS (SOUL_COMPARE_OPERATOR)
            #undef SOUL_COMPARE_OPERATOR
            return {};
        }